

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

void write_archive(archive *a,bsdtar *bsdtar)

{
  char cVar1;
  char **ppcVar2;
  FILE *f;
  ulong uVar3;
  int iVar4;
  wchar_t wVar5;
  int code;
  char *pcVar6;
  archive_entry_linkresolver *res;
  archive *paVar7;
  lafe_line_reader *lr;
  char **ppcVar8;
  char *pcVar9;
  int64_t iVar10;
  archive_entry *entry_00;
  archive_vtable_conflict *paVar11;
  int *piVar12;
  ulong uVar13;
  char *filename;
  archive_entry *entry;
  archive_entry *sparse_entry;
  undefined1 local_50 [24];
  archive_entry *local_38;
  
  uVar3 = 0x10000;
  do {
    uVar13 = uVar3;
    uVar3 = uVar13 * 2;
  } while (uVar13 < (ulong)(long)bsdtar->bytes_per_block);
  bsdtar->buff_size = uVar13 | 0x4000;
  pcVar6 = (char *)malloc(uVar13 | 0x4000);
  bsdtar->buff = pcVar6;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "cannot allocate memory";
  }
  else {
    res = archive_entry_linkresolver_new();
    bsdtar->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar6 = "cannot create link resolver";
    }
    else {
      iVar4 = archive_format(a);
      archive_entry_linkresolver_set_strategy(res,iVar4);
      paVar7 = archive_read_disk_new();
      bsdtar->diskreader = paVar7;
      if (paVar7 != (archive *)0x0) {
        if (bsdtar->symlink_mode == 'L') {
          archive_read_disk_set_symlink_logical(paVar7);
        }
        else if (bsdtar->symlink_mode == 'H') {
          archive_read_disk_set_symlink_hybrid(paVar7);
        }
        else {
          archive_read_disk_set_symlink_physical(paVar7);
        }
        archive_read_disk_set_matching(bsdtar->diskreader,bsdtar->matching,excluded_callback,bsdtar)
        ;
        archive_read_disk_set_metadata_filter_callback(bsdtar->diskreader,metadata_filter,bsdtar);
        pcVar6 = (char *)(ulong)(uint)bsdtar->readdisk_flags;
        archive_read_disk_set_behavior(bsdtar->diskreader,bsdtar->readdisk_flags);
        archive_read_disk_set_standard_lookup(bsdtar->diskreader);
        if (bsdtar->names_from_file != (char *)0x0) {
          bsdtar->next_line_is_dir = '\0';
          pcVar6 = (char *)(ulong)(uint)(int)bsdtar->option_null;
          lr = lafe_line_reader(bsdtar->names_from_file,(int)bsdtar->option_null);
          paVar7 = (archive *)lafe_line_reader_next(lr);
          while (paVar7 != (archive *)0x0) {
            if (bsdtar->next_line_is_dir == '\0') {
              cVar1 = (char)paVar7->magic;
              if ((bsdtar->option_null == '\0') && (cVar1 == '-')) {
                if ((*(char *)((long)&paVar7->magic + 1) == 'C') &&
                   (*(char *)((long)&paVar7->magic + 2) == '\0')) {
                  bsdtar->next_line_is_dir = '\x01';
                  goto LAB_001125a0;
                }
LAB_0011258a:
                do_chdir((bsdtar_conflict *)bsdtar);
              }
              else if (cVar1 != '/') goto LAB_0011258a;
              pcVar6 = (char *)a;
              write_hierarchy(bsdtar,a,(char *)paVar7);
            }
            else {
              if ((char)paVar7->magic == '\0') {
                pcVar6 = "Meaningless argument for -C: \'\'";
                lafe_warnc(0,"Meaningless argument for -C: \'\'");
                bsdtar->return_value = 1;
              }
              else {
                set_chdir((bsdtar_conflict *)bsdtar,(char *)paVar7);
                pcVar6 = (char *)paVar7;
              }
              bsdtar->next_line_is_dir = '\0';
            }
LAB_001125a0:
            paVar7 = (archive *)lafe_line_reader_next(lr);
          }
          lafe_line_reader_free(lr);
          if (bsdtar->next_line_is_dir != '\0') {
            piVar12 = __errno_location();
            iVar4 = *piVar12;
            pcVar6 = "Unexpected end of filename list; directory expected after -C";
            goto LAB_00112b21;
          }
        }
        ppcVar8 = bsdtar->argv;
        pcVar9 = *ppcVar8;
        if (pcVar9 == (char *)0x0) {
LAB_001128e0:
          archive_read_disk_set_matching
                    (bsdtar->diskreader,(archive *)0x0,
                     (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0,(void *)0x0);
          archive_read_disk_set_metadata_filter_callback
                    (bsdtar->diskreader,(_func_int_archive_ptr_void_ptr_archive_entry_ptr *)0x0,
                     (void *)0x0);
          local_50._0_8_ = (archive_entry *)0x0;
          archive_entry_linkify(bsdtar->resolver,(archive_entry **)local_50,&local_38);
joined_r0x00112928:
          do {
            if ((archive_entry *)local_50._0_8_ == (archive_entry *)0x0) {
              iVar4 = archive_write_close(a);
              if (iVar4 != 0) {
                pcVar6 = archive_error_string(a);
                lafe_warnc(0,"%s",pcVar6);
                paVar11 = (archive_vtable_conflict *)&bsdtar->return_value;
LAB_00112a61:
                *(int *)&paVar11->archive_close = 1;
              }
              free(bsdtar->buff);
              archive_entry_linkresolver_free(bsdtar->resolver);
              bsdtar->resolver = (archive_entry_linkresolver *)0x0;
              archive_read_free(bsdtar->diskreader);
              bsdtar->diskreader = (archive *)0x0;
              if (bsdtar->option_totals != '\0') {
                write_archive_cold_2();
              }
              archive_write_free(a);
              return;
            }
            paVar7 = bsdtar->diskreader;
            pcVar6 = archive_entry_sourcepath((archive_entry *)local_50._0_8_);
            wVar5 = archive_read_disk_open(paVar7,pcVar6);
            if (wVar5 != L'\0') {
              iVar4 = archive_errno(paVar7);
              pcVar6 = archive_error_string(paVar7);
              lafe_warnc(iVar4,"%s",pcVar6);
LAB_00112973:
              bsdtar->return_value = 1;
LAB_0011297e:
              archive_entry_free((archive_entry *)local_50._0_8_);
              goto joined_r0x00112928;
            }
            entry_00 = archive_entry_new();
            iVar4 = archive_read_next_header2(paVar7,entry_00);
            archive_entry_free(entry_00);
            if (iVar4 != 0) {
              code = archive_errno(paVar7);
              pcVar6 = archive_error_string(paVar7);
              lafe_warnc(code,"%s",pcVar6);
              if (iVar4 == -0x1e) goto LAB_00112973;
              archive_read_close(paVar7);
              goto LAB_0011297e;
            }
            write_file(bsdtar,a,(archive_entry *)local_50._0_8_);
            archive_entry_free((archive_entry *)local_50._0_8_);
            archive_read_close(paVar7);
            local_50._0_8_ = (archive_entry *)0x0;
            archive_entry_linkify(bsdtar->resolver,(archive_entry **)local_50,&local_38);
          } while( true );
        }
        local_50._8_8_ = &bsdtar->return_value;
LAB_001125f5:
        cVar1 = *pcVar9;
        if (cVar1 == '@') {
          if (pcVar9[1] != '/') {
LAB_0011262e:
            do_chdir((bsdtar_conflict *)bsdtar);
            if (*pcVar9 != '@') goto LAB_0011284f;
          }
          local_50._16_8_ = pcVar9 + 1;
          filename = (char *)local_50._16_8_;
          if ((pcVar9[1] == '-') && (pcVar9[2] == '\0')) {
            filename = (char *)0x0;
          }
          paVar7 = archive_read_new();
          archive_read_support_format_all(paVar7);
          archive_read_support_filter_all(paVar7);
          set_reader_options((bsdtar *)a,(archive *)pcVar6);
          archive_read_set_options(paVar7,"mtree:checkfs");
          wVar5 = archive_read_open_filename(paVar7,filename,(long)bsdtar->bytes_per_block);
          if (wVar5 == L'\0') {
LAB_0011282d:
            do {
              pcVar6 = (char *)local_50;
              iVar4 = archive_read_next_header(paVar7,(archive_entry **)local_50);
              if (iVar4 != 0) goto code_r0x00112840;
              wVar5 = archive_match_excluded(bsdtar->matching,(archive_entry *)local_50._0_8_);
              if (wVar5 == L'\0') {
                if (bsdtar->option_interactive != '\0') {
                  pcVar6 = archive_entry_pathname((archive_entry *)local_50._0_8_);
                  wVar5 = yes("copy \'%s\'",pcVar6);
                  if (wVar5 == L'\0') goto LAB_0011282d;
                }
                f = _stderr;
                if (bsdtar->verbose != 0) {
                  pcVar6 = archive_entry_pathname((archive_entry *)local_50._0_8_);
                  safe_fprintf((FILE_conflict *)f,"a %s",pcVar6);
                }
                iVar4 = need_report();
                if (iVar4 != 0) {
                  report_write((bsdtar *)(ulong)(uint)bsdtar->verbose,a,
                               (archive_entry *)local_50._0_8_,0);
                }
                iVar4 = archive_write_header(a,(archive_entry *)local_50._0_8_);
                if (iVar4 == 0) {
LAB_001127bb:
                  iVar10 = archive_entry_size((archive_entry *)local_50._0_8_);
                  if (iVar10 == 0) {
                    archive_read_data_skip(paVar7);
                  }
                  else {
                    iVar4 = copy_file_data_block(bsdtar,a,paVar7,(archive_entry *)local_50._0_8_);
                    if (iVar4 != 0) {
LAB_00112af7:
                      exit(1);
                    }
                  }
                }
                else {
                  if (bsdtar->verbose == 0) {
                    pcVar6 = archive_entry_pathname((archive_entry *)local_50._0_8_);
                    archive_error_string(a);
                    lafe_warnc(0,"%s: %s",pcVar6);
                  }
                  else {
                    write_archive_cold_1();
                  }
                  if (iVar4 == -0x1e) goto LAB_00112af7;
                  if (-0x15 < iVar4) goto LAB_001127bb;
                }
                if (bsdtar->verbose != 0) {
                  fputc(10,_stderr);
                }
              }
            } while( true );
          }
          pcVar9 = archive_error_string(paVar7);
          pcVar6 = "%s";
          lafe_warnc(0,"%s",pcVar9);
          *(int *)(_func_int_archive_ptr **)local_50._8_8_ = 1;
        }
        else {
          if (cVar1 == '/') {
LAB_0011284f:
            pcVar6 = (char *)a;
            write_hierarchy(bsdtar,a,pcVar9);
            goto LAB_0011285d;
          }
          if ((cVar1 != '-') || (pcVar9[1] != 'C')) goto LAB_0011262e;
          if (pcVar9[2] == '\0') {
            bsdtar->argv = ppcVar8 + 1;
            pcVar6 = ppcVar8[1];
            if ((archive *)pcVar6 == (archive *)0x0) {
              lafe_warnc(0,"%s","Missing argument for -C");
              paVar11 = (archive_vtable_conflict *)local_50._8_8_;
              goto LAB_00112a61;
            }
            if ((char)((archive *)pcVar6)->magic == '\0') {
              lafe_warnc(0,"Meaningless argument for -C: \'\'");
              paVar11 = (archive_vtable_conflict *)local_50._8_8_;
              goto LAB_00112a61;
            }
          }
          else {
            pcVar6 = pcVar9 + 2;
          }
          set_chdir((bsdtar_conflict *)bsdtar,pcVar6);
        }
        goto LAB_0011285d;
      }
      pcVar6 = "Cannot create read_disk object";
    }
  }
  iVar4 = 0;
LAB_00112b21:
  lafe_errc(1,iVar4,pcVar6);
code_r0x00112840:
  if (iVar4 != 1) {
    archive_error_string(paVar7);
    lafe_warnc(0,"Error reading archive %s: %s",local_50._16_8_);
    *(int *)(_func_int_archive_ptr **)local_50._8_8_ = 1;
    archive_read_free(paVar7);
    goto LAB_001128e0;
  }
  archive_read_free(paVar7);
LAB_0011285d:
  ppcVar2 = bsdtar->argv;
  ppcVar8 = ppcVar2 + 1;
  bsdtar->argv = ppcVar8;
  pcVar9 = ppcVar2[1];
  if (pcVar9 == (char *)0x0) goto LAB_001128e0;
  goto LAB_001125f5;
}

Assistant:

static void
write_archive(struct archive *a, struct bsdtar *bsdtar)
{
	const char *arg;
	struct archive_entry *entry, *sparse_entry;

	/* Choose a suitable copy buffer size */
	bsdtar->buff_size = 64 * 1024;
	while (bsdtar->buff_size < (size_t)bsdtar->bytes_per_block)
	  bsdtar->buff_size *= 2;
	/* Try to compensate for space we'll lose to alignment. */
	bsdtar->buff_size += 16 * 1024;

	/* Allocate a buffer for file data. */
	if ((bsdtar->buff = malloc(bsdtar->buff_size)) == NULL)
		lafe_errc(1, 0, "cannot allocate memory");

	if ((bsdtar->resolver = archive_entry_linkresolver_new()) == NULL)
		lafe_errc(1, 0, "cannot create link resolver");
	archive_entry_linkresolver_set_strategy(bsdtar->resolver,
	    archive_format(a));

	/* Create a read_disk object. */
	if ((bsdtar->diskreader = archive_read_disk_new()) == NULL)
		lafe_errc(1, 0, "Cannot create read_disk object");
	/* Tell the read_disk how handle symlink. */
	switch (bsdtar->symlink_mode) {
	case 'H':
		archive_read_disk_set_symlink_hybrid(bsdtar->diskreader);
		break;
	case 'L':
		archive_read_disk_set_symlink_logical(bsdtar->diskreader);
		break;
	default:
		archive_read_disk_set_symlink_physical(bsdtar->diskreader);
		break;
	}
	/* Register entry filters. */
	archive_read_disk_set_matching(bsdtar->diskreader,
	    bsdtar->matching, excluded_callback, bsdtar);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, metadata_filter, bsdtar);
	/* Set the behavior of archive_read_disk. */
	archive_read_disk_set_behavior(bsdtar->diskreader,
	    bsdtar->readdisk_flags);
	archive_read_disk_set_standard_lookup(bsdtar->diskreader);

	if (bsdtar->names_from_file != NULL)
		archive_names_from_file(bsdtar, a);

	while (*bsdtar->argv) {
		arg = *bsdtar->argv;
		if (arg[0] == '-' && arg[1] == 'C') {
			arg += 2;
			if (*arg == '\0') {
				bsdtar->argv++;
				arg = *bsdtar->argv;
				if (arg == NULL) {
					lafe_warnc(0, "%s",
					    "Missing argument for -C");
					bsdtar->return_value = 1;
					goto cleanup;
				}
				if (*arg == '\0') {
					lafe_warnc(0,
					    "Meaningless argument for -C: ''");
					bsdtar->return_value = 1;
					goto cleanup;
				}
			}
			set_chdir(bsdtar, arg);
		} else {
			if (*arg != '/' && (arg[0] != '@' || arg[1] != '/'))
				do_chdir(bsdtar); /* Handle a deferred -C */
			if (*arg == '@') {
				if (append_archive_filename(bsdtar, a,
				    arg + 1) != 0)
					break;
			} else
				write_hierarchy(bsdtar, a, arg);
		}
		bsdtar->argv++;
	}

	archive_read_disk_set_matching(bsdtar->diskreader, NULL, NULL, NULL);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, NULL, NULL);
	entry = NULL;
	archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	while (entry != NULL) {
		int r;
		struct archive_entry *entry2;
		struct archive *disk = bsdtar->diskreader;

		/*
		 * This tricky code here is to correctly read the cotents
		 * of the entry because the disk reader bsdtar->diskreader
		 * is pointing at does not have any information about the
		 * entry by this time and using archive_read_data_block()
		 * with the disk reader consequently must fail. And we
		 * have to re-open the entry to read the contents.
		 */
		/* TODO: Work with -C option as well. */
		r = archive_read_disk_open(disk,
			archive_entry_sourcepath(entry));
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			bsdtar->return_value = 1;
			archive_entry_free(entry);
			continue;
		}

		/*
		 * Invoke archive_read_next_header2() to work
		 * archive_read_data_block(), which is called via write_file(),
		 * without failure.
		 */
		entry2 = archive_entry_new();
		r = archive_read_next_header2(disk, entry2);
		archive_entry_free(entry2);
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			if (r == ARCHIVE_FATAL)
				bsdtar->return_value = 1;
			else
				archive_read_close(disk);
			archive_entry_free(entry);
			continue;
		}

		write_file(bsdtar, a, entry);
		archive_entry_free(entry);
		archive_read_close(disk);
		entry = NULL;
		archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	}

	if (archive_write_close(a)) {
		lafe_warnc(0, "%s", archive_error_string(a));
		bsdtar->return_value = 1;
	}

cleanup:
	/* Free file data buffer. */
	free(bsdtar->buff);
	archive_entry_linkresolver_free(bsdtar->resolver);
	bsdtar->resolver = NULL;
	archive_read_free(bsdtar->diskreader);
	bsdtar->diskreader = NULL;

	if (bsdtar->option_totals) {
		fprintf(stderr, "Total bytes written: %s\n",
		    tar_i64toa(archive_filter_bytes(a, -1)));
	}

	archive_write_free(a);
}